

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O1

void __thiscall Fl_Menu_Type::build_menu(Fl_Menu_Type *this)

{
  int *piVar1;
  Fl_Menu_ *this_00;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  Fl_Menu_Item *pFVar7;
  char *pcVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  Fl_Menu_Item_Type *i;
  Fl_Type *pFVar12;
  
  this_00 = (Fl_Menu_ *)(this->super_Fl_Widget_Type).o;
  iVar10 = 0;
  for (pFVar12 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
      (pFVar12 != (Fl_Type *)0x0 &&
      ((this->super_Fl_Widget_Type).super_Fl_Type.level < pFVar12->level)); pFVar12 = pFVar12->next)
  {
    iVar5 = (*pFVar12->_vptr_Fl_Type[0x16])(pFVar12);
    iVar10 = (iVar10 - (uint)(iVar5 == 0)) + 2;
  }
  iVar5 = this->menusize;
  if (iVar10 == 0) {
    if ((iVar5 != 0) && (this_00->menu_ != (Fl_Menu_Item *)0x0)) {
      operator_delete__(this_00->menu_);
    }
    Fl_Menu_::menu(this_00,(Fl_Menu_Item *)0x0);
    this->menusize = 0;
  }
  else {
    if (iVar5 <= iVar10) {
      if ((iVar5 != 0) && (this_00->menu_ != (Fl_Menu_Item *)0x0)) {
        operator_delete__(this_00->menu_);
      }
      this->menusize = iVar10 + 0xb;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)(iVar10 + 0xb);
      uVar11 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
        uVar11 = SUB168(auVar4 * ZEXT816(0x38),0);
      }
      pFVar7 = (Fl_Menu_Item *)operator_new__(uVar11);
      Fl_Menu_::menu(this_00,pFVar7);
    }
    pFVar12 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
    if (pFVar12 != (Fl_Type *)0x0) {
      piVar1 = &(this->super_Fl_Widget_Type).super_Fl_Type.level;
      iVar10 = *piVar1 + 1;
      pFVar7 = this_00->menu_;
      do {
        if (pFVar12->level <= *piVar1) break;
        pFVar2 = pFVar12[1].prev;
        pFVar3 = pFVar2->parent;
        if (pFVar3 == (Fl_Type *)0x0) {
          pcVar8 = pFVar2->comment_;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "(nolabel)";
          }
          pFVar7->text = pcVar8;
          pFVar7->labeltype_ = *(uchar *)&pFVar2->prev;
        }
        else {
          (*pFVar3->_vptr_Fl_Type[6])(pFVar3,pFVar7);
        }
        pFVar7->shortcut_ = *(int *)&pFVar12[1].prev[1]._vptr_Fl_Type;
        pFVar7->callback_ = (Fl_Callback *)0x0;
        pFVar7->user_data_ = pFVar12;
        iVar5 = Fl_Menu_Item_Type::flags((Fl_Menu_Item_Type *)pFVar12);
        pFVar7->flags = iVar5;
        pFVar2 = pFVar12[1].prev;
        pFVar7->labelfont_ = pFVar2->level;
        pFVar7->labelsize_ = *(Fl_Fontsize *)&pFVar2->field_0x4c;
        pFVar7->labelcolor_ = *(Fl_Color *)&pFVar2->next;
        iVar6 = (*pFVar12->_vptr_Fl_Type[0x16])(pFVar12);
        iVar5 = iVar10;
        if (iVar6 != 0) {
          iVar5 = iVar10 + 1;
          *(byte *)&pFVar7->flags = (byte)pFVar7->flags | 0x40;
        }
        piVar9 = piVar1;
        if ((pFVar12->next != (Fl_Type *)0x0) &&
           (iVar10 = (*pFVar12->next->_vptr_Fl_Type[0x1e])(), iVar10 != 0)) {
          piVar9 = &pFVar12->next->level;
        }
        iVar10 = *piVar9;
        for (; pFVar7 = pFVar7 + 1, iVar10 < iVar5; iVar5 = iVar5 + -1) {
          pFVar7->text = (char *)0x0;
        }
        pFVar12 = pFVar12->next;
      } while (pFVar12 != (Fl_Type *)0x0);
    }
  }
  Fl_Widget::redraw((this->super_Fl_Widget_Type).o);
  return;
}

Assistant:

void Fl_Menu_Type::build_menu() {
  Fl_Menu_* w = (Fl_Menu_*)o;
  // count how many Fl_Menu_Item structures needed:
  int n = 0;
  Fl_Type* q;
  for (q = next; q && q->level > level; q = q->next) {
    if (q->is_parent()) n++; // space for null at end of submenu
    n++;
  }
  if (!n) {
    if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
    w->menu(0);
    menusize = 0;
  } else {
    n++; // space for null at end of menu
    if (menusize<n) {
      if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
      menusize = n+10;
      w->menu(new Fl_Menu_Item[menusize]);
    }
    // fill them all in:
    Fl_Menu_Item* m = (Fl_Menu_Item*)(w->menu());
    int lvl = level+1;
    for (q = next; q && q->level > level; q = q->next) {
      Fl_Menu_Item_Type* i = (Fl_Menu_Item_Type*)q;
      if (i->o->image()) i->o->image()->label(m);
      else {
        m->label(i->o->label() ? i->o->label() : "(nolabel)");
        m->labeltype(i->o->labeltype());
      }
      m->shortcut(((Fl_Button*)(i->o))->shortcut());
      m->callback(0,(void*)i);
      m->flags = i->flags();
      m->labelfont(i->o->labelfont());
      m->labelsize(i->o->labelsize());
      m->labelcolor(i->o->labelcolor());
      if (q->is_parent()) {lvl++; m->flags |= FL_SUBMENU;}
      m++;
      int l1 =
	(q->next && q->next->is_menu_item()) ? q->next->level : level;
      while (lvl > l1) {m->label(0); m++; lvl--;}
      lvl = l1;
    }
  }
  o->redraw();
}